

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

void __thiscall asmjit::HostRuntime::HostRuntime(HostRuntime *this)

{
  CpuInfo *pCVar1;
  
  (this->super_Runtime)._codeInfo._archInfo = (anon_union_4_2_424c626f_for_ArchInfo_0)0x0;
  (this->super_Runtime)._codeInfo.field_1 = (anon_union_4_2_314a35c9_for_CodeInfo_1)0x0;
  (this->super_Runtime)._codeInfo._baseAddress = 0xffffffffffffffff;
  (this->super_Runtime)._vptr_Runtime = (_func_int **)&PTR__HostRuntime_0019cbc8;
  (this->super_Runtime)._runtimeType = '\x01';
  (this->super_Runtime)._allocType = '\0';
  pCVar1 = CpuInfo::getHost();
  (this->super_Runtime)._codeInfo._archInfo.field_0 = (pCVar1->_archInfo).field_0;
  (this->super_Runtime)._codeInfo.field_1._packedMiscInfo = 0x21212110;
  return;
}

Assistant:

HostRuntime::HostRuntime() noexcept {
  _runtimeType = kRuntimeJit;

  // Setup the CodeInfo of this Runtime.
  _codeInfo._archInfo       = CpuInfo::getHost().getArchInfo();
  _codeInfo._stackAlignment = static_cast<uint8_t>(hostDetectNaturalStackAlignment());
  _codeInfo._cdeclCallConv  = CallConv::kIdHostCDecl;
  _codeInfo._stdCallConv    = CallConv::kIdHostStdCall;
  _codeInfo._fastCallConv   = CallConv::kIdHostFastCall;
}